

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O1

Features GetWabtFeatures(ChakraContext *ctx)

{
  anon_struct_1_4_dfdf154f_for_features aVar1;
  Features FVar2;
  
  aVar1 = ctx->features;
  FVar2._0_8_ = (ulong)(((byte)aVar1 & 8) << 0xd) +
                ((ulong)(((byte)aVar1 & 1) << 0x18) |
                (ulong)((byte)aVar1 >> 2 & 1) << 0x20 | (ulong)((byte)aVar1 >> 1 & 1) << 0x28) +
                0x100;
  FVar2.bulk_memory_enabled_ = false;
  return FVar2;
}

Assistant:

Features GetWabtFeatures(const ChakraContext& ctx)
{
    Features features;
    if (ctx.features.sign_extends)
    {
        features.enable_sign_extension();
    }
    if (ctx.features.threads)
    {
        features.enable_threads();
    }
    if (ctx.features.simd)
    {
        features.enable_simd();
    }
    if (ctx.features.sat_float_to_int)
    {
        features.enable_sat_float_to_int();
    }

    // Enable wabt features that have made it into the spec
    features.enable_mutable_globals();
    return features;
}